

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestMeasurementXMLParser.cxx
# Opt level: O1

void __thiscall
cmCTestTestMeasurementXMLParser::StartElement
          (cmCTestTestMeasurementXMLParser *this,string *name,char **attributes)

{
  char *pcVar1;
  string *psVar2;
  int iVar3;
  char **ppcVar4;
  string *psVar5;
  char *pcVar6;
  
  (this->CharacterData)._M_string_length = 0;
  *(this->CharacterData)._M_dataplus._M_p = '\0';
  std::__cxx11::string::_M_assign((string *)&this->ElementName);
  pcVar6 = *attributes;
  if (pcVar6 != (char *)0x0) {
    ppcVar4 = attributes + 2;
    do {
      iVar3 = strcmp(pcVar6,"name");
      psVar5 = &this->MeasurementName;
      psVar2 = &this->MeasurementName;
      if (iVar3 == 0) {
LAB_001e07ce:
        pcVar6 = ppcVar4[-1];
        pcVar1 = (char *)psVar2->_M_string_length;
        strlen(pcVar6);
        std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar1,(ulong)pcVar6);
      }
      else {
        iVar3 = strcmp(pcVar6,"type");
        psVar5 = &this->MeasurementType;
        psVar2 = &this->MeasurementType;
        if (iVar3 == 0) goto LAB_001e07ce;
      }
      pcVar6 = *ppcVar4;
      ppcVar4 = ppcVar4 + 2;
    } while (pcVar6 != (char *)0x0);
  }
  return;
}

Assistant:

void cmCTestTestMeasurementXMLParser::StartElement(const std::string& name,
                                                   const char** attributes)
{
  this->CharacterData.clear();
  this->ElementName = name;
  for (const char** attr = attributes; *attr; attr += 2) {
    if (strcmp(attr[0], "name") == 0) {
      this->MeasurementName = attr[1];
    } else if (strcmp(attr[0], "type") == 0) {
      this->MeasurementType = attr[1];
    }
  }
}